

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

void __thiscall
myvk::RenderPassState::RegisterAttachment
          (RenderPassState *this,uint32_t attachment,char *attachment_str,VkFormat format,
          VkImageLayout initial_layout,VkImageLayout final_layout,VkSampleCountFlagBits samples,
          VkAttachmentLoadOp load_op,VkAttachmentStoreOp store_op,VkAttachmentLoadOp stencil_load_op
          ,VkAttachmentStoreOp stencil_store_op)

{
  value_type *__x;
  reference pvVar1;
  VkFormat in_ECX;
  uint in_ESI;
  long in_RDI;
  VkImageLayout in_R8D;
  VkImageLayout in_R9D;
  VkSampleCountFlagBits in_stack_00000008;
  VkAttachmentLoadOp in_stack_00000010;
  VkAttachmentStoreOp in_stack_00000018;
  VkAttachmentLoadOp in_stack_00000020;
  VkAttachmentStoreOp in_stack_00000028;
  VkAttachmentDescription *des;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  uint *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffff90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_50;
  VkImageLayout local_20;
  VkFormat local_1c;
  uint local_c;
  
  __x = (value_type *)(in_RDI + 0x30);
  this_00 = &local_50;
  local_50._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_c = in_ESI;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*&,_unsigned_int_&,_true>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::insert(this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)0x2cfb63);
  pvVar1 = std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::
           operator[]((vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> *)
                      (in_RDI + 0x60),(ulong)local_c);
  pvVar1->flags = 0;
  pvVar1->format = local_1c;
  pvVar1->initialLayout = local_20;
  pvVar1->finalLayout = local_50._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  pvVar1->samples = in_stack_00000008;
  pvVar1->loadOp = in_stack_00000010;
  pvVar1->storeOp = in_stack_00000018;
  pvVar1->stencilLoadOp = in_stack_00000020;
  pvVar1->stencilStoreOp = in_stack_00000028;
  return;
}

Assistant:

void RenderPassState::RegisterAttachment(uint32_t attachment, const char *attachment_str, VkFormat format,
                                         VkImageLayout initial_layout, VkImageLayout final_layout,
                                         VkSampleCountFlagBits samples, VkAttachmentLoadOp load_op,
                                         VkAttachmentStoreOp store_op, VkAttachmentLoadOp stencil_load_op,
                                         VkAttachmentStoreOp stencil_store_op) {
	assert(attachment < get_attachment_count());
	assert(m_attachment_map.find(attachment_str) == m_attachment_map.end());
	assert(m_attachment_descriptions[attachment].flags == VK_ATTACHMENT_DESCRIPTION_FLAG_BITS_MAX_ENUM);

	m_attachment_map.insert({attachment_str, attachment});
	VkAttachmentDescription &des = m_attachment_descriptions[attachment];
	des.flags = 0; // TODO: attachment description flags ?
	des.format = format;
	des.initialLayout = initial_layout;
	des.finalLayout = final_layout;
	des.samples = samples;
	des.loadOp = load_op;
	des.storeOp = store_op;
	des.stencilLoadOp = stencil_load_op;
	des.stencilStoreOp = stencil_store_op;
}